

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O3

uint8_t * apx_attributeParser_parse_port_attributes
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,
                    apx_portAttributes_t *attr)

{
  uint8_t uVar1;
  apx_error_t aVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *pBegin;
  
  if (((end == (uint8_t *)0x0) || (begin == (uint8_t *)0x0)) || (end < begin)) {
    if (self == (apx_attributeParser_t *)0x0) {
LAB_00122bd6:
      __assert_fail("self != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                    ,0x17a,
                    "void apx_attributeParser_set_error(apx_attributeParser_t *, apx_error_t, const uint8_t *)"
                   );
    }
    aVar2 = 1;
    puVar3 = (uint8_t *)0x0;
LAB_00122b9d:
    begin = (uint8_t *)0x0;
LAB_00122b9f:
    self->last_error = aVar2;
    self->error_next = puVar3;
  }
  else if (begin < end) {
    do {
      begin = bstr_lstrip(begin,end);
      if (begin == end) {
        return begin;
      }
      uVar1 = *begin;
      if (uVar1 == 'Q') {
        puVar3 = begin + 1;
        if (puVar3 < end) {
          if (*puVar3 != '[') goto LAB_00122bbb;
          puVar4 = bstr_lstrip(begin + 2,end);
          if (puVar4 < end) {
            pBegin = apx_parserBase_parse_u32(puVar4,end,&attr->queue_length);
            if (pBegin <= puVar4) goto LAB_00122bbb;
            puVar4 = bstr_lstrip(pBegin,end);
            if (puVar4 < end) {
              puVar3 = puVar4 + 1;
              if (*puVar4 != ']') {
                puVar3 = (uint8_t *)0x0;
              }
              goto LAB_00122ad4;
            }
          }
        }
      }
      else {
        if (uVar1 != 'P') {
          if (uVar1 == '=') {
            puVar3 = apx_attributeParser_parse_initializer(self,begin + 1,end,&attr->init_value);
LAB_00122ad4:
            if (begin < puVar3) goto LAB_00122b69;
          }
LAB_00122bbb:
          aVar2 = 3;
          puVar3 = begin;
          if (self != (apx_attributeParser_t *)0x0) goto LAB_00122b9f;
          goto LAB_00122bd6;
        }
        puVar3 = begin + 1;
        attr->is_parameter = true;
      }
LAB_00122b69:
      puVar3 = bstr_lstrip(puVar3,end);
      if (puVar3 == end) {
        return puVar3;
      }
      if (*puVar3 != ',') {
        if (self == (apx_attributeParser_t *)0x0) goto LAB_00122bd6;
        aVar2 = 3;
        goto LAB_00122b9d;
      }
      begin = puVar3 + 1;
    } while (begin < end);
  }
  return begin;
}

Assistant:

uint8_t const* apx_attributeParser_parse_port_attributes(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, apx_portAttributes_t* attr)
{
   uint8_t const* next = begin;
   if ((end < begin) || (begin == NULL) || (end == NULL))
   {
      apx_attributeParser_set_error(self, APX_INVALID_ARGUMENT_ERROR, NULL);
      return NULL;
   }
   while (next < end)
   {
      next = bstr_lstrip(next, end);
      if (next == end)
      {
         break;
      }
      uint8_t const* result = apx_attributeParser_parse_single_port_attribute(self, next, end, attr);
      if (result > next)
      {
         next = bstr_lstrip(result, end);
         if (next == end)
         {
            break;
         }
         if (*next == ',')
         {
            next++;
         }
         else
         {
            apx_attributeParser_set_error(self, APX_PARSE_ERROR, next);
            next = NULL;
            break;
         }
      }
      else
      {
         break;
      }
   }
   return next;

}